

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O2

void __thiscall libDAI::HAK::constructMessages(HAK *this)

{
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *pvVar1;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *this_00;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  size_t beta;
  long lVar3;
  size_t alpha;
  ulong uVar4;
  TFactor<double> TStack_68;
  
  pvVar1 = &this->_Qa;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear(pvVar1);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (pvVar1,*(long *)(CONCAT44(extraout_var,iVar2) + 0xe8) -
                    *(long *)(CONCAT44(extraout_var,iVar2) + 0xe0) >> 6);
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0xe8) -
                *(long *)(CONCAT44(extraout_var_00,iVar2) + 0xe0) >> 6) <= uVar4) break;
    iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::TFactor
              (&TStack_68,(VarSet *)(*(long *)(CONCAT44(extraout_var_01,iVar2) + 0xe0) + lVar3));
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1,
               &TStack_68);
    TFactor<double>::~TFactor(&TStack_68);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x40;
  }
  pvVar1 = &this->_Qb;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear(pvVar1);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (pvVar1,(*(long *)(CONCAT44(extraout_var_02,iVar2) + 0x100) -
                    *(long *)(CONCAT44(extraout_var_02,iVar2) + 0xf8)) / 0x28);
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((ulong)((*(long *)(CONCAT44(extraout_var_03,iVar2) + 0x100) -
                *(long *)(CONCAT44(extraout_var_03,iVar2) + 0xf8)) / 0x28) <= uVar4) break;
    iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::TFactor
              (&TStack_68,(VarSet *)(*(long *)(CONCAT44(extraout_var_04,iVar2) + 0xf8) + lVar3));
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1,
               &TStack_68);
    TFactor<double>::~TFactor(&TStack_68);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x28;
  }
  pvVar1 = &this->_muab;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear(pvVar1);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (pvVar1,*(long *)(CONCAT44(extraout_var_05,iVar2) + 0x118) -
                    *(long *)(CONCAT44(extraout_var_05,iVar2) + 0x110) >> 4);
  this_00 = &this->_muba;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear(this_00);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (this_00,*(long *)(CONCAT44(extraout_var_06,iVar2) + 0x118) -
                     *(long *)(CONCAT44(extraout_var_06,iVar2) + 0x110) >> 4);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar3 = *(long *)(CONCAT44(extraout_var_07,iVar2) + 0x110);
  while( true ) {
    iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if (lVar3 == *(long *)(CONCAT44(extraout_var_08,iVar2) + 0x118)) break;
    iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::TFactor
              (&TStack_68,
               (VarSet *)
               (*(long *)(lVar3 + 8) * 0x28 + *(long *)(CONCAT44(extraout_var_09,iVar2) + 0xf8)));
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1,
               &TStack_68);
    TFactor<double>::~TFactor(&TStack_68);
    iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::TFactor
              (&TStack_68,
               (VarSet *)
               (*(long *)(lVar3 + 8) * 0x28 + *(long *)(CONCAT44(extraout_var_10,iVar2) + 0xf8)));
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)this_00,
               &TStack_68);
    TFactor<double>::~TFactor(&TStack_68);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void HAK::constructMessages() {
        // Create outer beliefs
        _Qa.clear();
        _Qa.reserve(grm().nr_ORs());
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( Factor( grm().OR(alpha).vars() ) );

        // Create inner beliefs
        _Qb.clear();
        _Qb.reserve(grm().nr_IRs());
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            _Qb.push_back( Factor( grm().IR(beta) ) );
        
        // Create messages
        _muab.clear();
        _muab.reserve(grm().nr_Redges());
        _muba.clear();
        _muba.reserve(grm().nr_Redges());
        for( vector<RegionGraph::R_edge_t>::const_iterator ab = grm().Redges().begin(); ab != grm().Redges().end(); ab++ ) {
            _muab.push_back( Factor( grm().IR(ab->second) ) );
            _muba.push_back( Factor( grm().IR(ab->second) ) );
        }
    }